

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O0

Error asmjit::_abi_1_10::x86::Emitter_emitProlog(BaseEmitter *emitter,FuncFrame *frame)

{
  Error EVar1;
  undefined8 in_RDI;
  EmitHelper emitHelper;
  FuncFrame *in_stack_000000c0;
  EmitHelper *in_stack_000000c8;
  undefined2 uVar2;
  BaseEmitter *in_stack_ffffffffffffffd8;
  EmitHelper *in_stack_ffffffffffffffe0;
  
  uVar2 = (undefined2)((ulong)in_RDI >> 0x30);
  FuncFrame::isAvxEnabled((FuncFrame *)0x18abc2);
  FuncFrame::isAvx512Enabled((FuncFrame *)0x18abd0);
  EmitHelper::EmitHelper
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,SUB21((ushort)uVar2 >> 8,0),
             SUB21(uVar2,0));
  EVar1 = EmitHelper::emitProlog(in_stack_000000c8,in_stack_000000c0);
  return EVar1;
}

Assistant:

static Error ASMJIT_CDECL Emitter_emitProlog(BaseEmitter* emitter, const FuncFrame& frame) {
  EmitHelper emitHelper(emitter, frame.isAvxEnabled(), frame.isAvx512Enabled());
  return emitHelper.emitProlog(frame);
}